

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodeSetPtr xmlXPathPopNodeSet(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr obj_00;
  xmlNodeSetPtr ret;
  xmlXPathObjectPtr obj;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else if (ctxt->value == (xmlXPathObjectPtr)0x0) {
    xmlXPatherror(ctxt,"/workspace/llm4binary/github/license_c_cmakelists/GNOME[P]libxml2/xpath.c",
                  0x887,10);
    if (ctxt != (xmlXPathParserContextPtr)0x0) {
      ctxt->error = 10;
    }
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
          ((ctxt->value->type != XPATH_NODESET && (ctxt->value->type != XPATH_XSLT_TREE)))) {
    xmlXPatherror(ctxt,"/workspace/llm4binary/github/license_c_cmakelists/GNOME[P]libxml2/xpath.c",
                  0x88b,0xb);
    if (ctxt != (xmlXPathParserContextPtr)0x0) {
      ctxt->error = 0xb;
    }
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else {
    obj_00 = xmlXPathValuePop(ctxt);
    ctxt_local = (xmlXPathParserContextPtr)obj_00->nodesetval;
    obj_00->nodesetval = (xmlNodeSetPtr)0x0;
    xmlXPathReleaseObject(ctxt->context,obj_00);
  }
  return (xmlNodeSetPtr)ctxt_local;
}

Assistant:

xmlNodeSetPtr
xmlXPathPopNodeSet (xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr obj;
    xmlNodeSetPtr ret;

    if (ctxt == NULL) return(NULL);
    if (ctxt->value == NULL) {
	xmlXPathSetError(ctxt, XPATH_INVALID_OPERAND);
	return(NULL);
    }
    if (!xmlXPathStackIsNodeSet(ctxt)) {
	xmlXPathSetTypeError(ctxt);
	return(NULL);
    }
    obj = xmlXPathValuePop(ctxt);
    ret = obj->nodesetval;
    obj->nodesetval = NULL;
    xmlXPathReleaseObject(ctxt->context, obj);
    return(ret);
}